

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

void transsub(quadtype nextquad)

{
  char local_12 [8];
  char label [10];
  
  fprintf((FILE *)ofp,"; ");
  fprintlexeme(ofp,nextquad.opcode);
  fprintf((FILE *)ofp," := ");
  fprintlexeme(ofp,nextquad.op1.opnd);
  fprintf((FILE *)ofp," - ");
  fprintlexeme(ofp,nextquad.op2.opnd);
  fprintf((FILE *)ofp,"\n");
  getjumplabel(local_12);
  emitfromone(opcmov,"ax",nextquad.op1.opnd);
  emitfromone(opcmov,"bx",nextquad.op2.opnd);
  fprintf((FILE *)ofp,"         sub       ax, bx\n");
  emittoone(opcmov,nextquad.opcode,"ax");
  fprintf((FILE *)ofp,"%s:\n\n",local_12);
  return;
}

Assistant:

void    transsub(struct quadtype nextquad)
{
    char    label[LABELSIZE];
    
    fprintf(ofp, "; ");
    fprintlexeme(ofp, nextquad.op1.opnd);
    fprintf(ofp, " := ");
    fprintlexeme(ofp, nextquad.op2.opnd);
    fprintf(ofp, " - ");
    fprintlexeme(ofp, nextquad.op3.opnd);
    fprintf(ofp, "\n");
    
    getjumplabel(label);
    emitfromone(opcmov, "ax", nextquad.op2.opnd);
    emitfromone(opcmov, "bx", nextquad.op3.opnd);
    fprintf(ofp, "         sub       ax, bx\n");
    //  fprintf(ofp, "         jc        iovrflo\n");
    emittoone(opcmov, nextquad.op1.opnd, "ax");
    
    fprintf(ofp, "%s:\n\n", label);
}